

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-common.c
# Opt level: O0

int uv_barrier_wait(uv_barrier_t *barrier)

{
  int iVar1;
  int rc;
  uv_barrier_t *barrier_local;
  
  iVar1 = pthread_barrier_wait((pthread_barrier_t *)barrier);
  if ((iVar1 != 0) && (iVar1 != -1)) {
    abort();
  }
  return (int)(iVar1 == -1);
}

Assistant:

int uv_barrier_wait(uv_barrier_t* barrier) {
  int rc;

  rc = pthread_barrier_wait(barrier);
  if (rc != 0)
    if (rc != PTHREAD_BARRIER_SERIAL_THREAD)
      abort();

  return rc == PTHREAD_BARRIER_SERIAL_THREAD;
}